

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeavyRowGenerator.cpp
# Opt level: O0

bool IsFullRank(uint8_t *matrix,uint offset)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  int in_ESI;
  long in_RDI;
  uint8_t elim;
  uint8_t rem_value;
  uint8_t *rem_row;
  uint ge_row_k;
  uint k;
  uint8_t temp;
  uint8_t row0;
  uint8_t *ge_row;
  uint ge_row_j;
  uint j;
  bool found;
  uint i_1;
  uint i;
  uint8_t pivot [6];
  int in_stack_000003a4;
  void *in_stack_000003a8;
  uint8_t in_stack_000003b7;
  void *in_stack_000003b8;
  uint local_40;
  uint local_2c;
  uint local_24;
  uint local_20;
  byte abStack_1a [6];
  int local_14;
  long local_10;
  char local_2;
  char local_1;
  
  for (local_20 = 0; local_20 < 6; local_20 = local_20 + 1) {
    abStack_1a[local_20] = (byte)local_20;
  }
  local_24 = 0;
  local_14 = in_ESI;
  local_10 = in_RDI;
  do {
    if (5 < local_24) {
      return true;
    }
    bVar3 = false;
    local_2c = local_24;
    while( true ) {
      if (5 < local_2c) goto LAB_0010e3bf;
      cVar1 = *(char *)(local_10 + (ulong)((uint)abStack_1a[local_2c] * 0x12) +
                       (ulong)(local_14 + local_24));
      if (cVar1 != '\0') break;
      local_2c = local_2c + 1;
    }
    bVar3 = true;
    if (local_24 != local_2c) {
      bVar2 = abStack_1a[local_24];
      abStack_1a[local_24] = abStack_1a[local_2c];
      abStack_1a[local_2c] = bVar2;
    }
    while (local_40 = local_2c + 1, local_40 < 6) {
      local_1 = *(char *)(local_10 + (ulong)((uint)abStack_1a[local_40] * 0x12) +
                         (ulong)(local_14 + local_24));
      local_2c = local_40;
      if (local_1 != '\0') {
        local_2 = cVar1;
        gf256_muladd_mem(in_stack_000003b8,in_stack_000003b7,in_stack_000003a8,in_stack_000003a4);
      }
    }
LAB_0010e3bf:
    if (!bVar3) {
      return false;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

static bool IsFullRank(
    uint8_t * matrix,
    const unsigned offset
)
{
    uint8_t pivot[kRows];

    // Initialize pivot array
    for (unsigned i = 0; i < kRows; ++i) {
        pivot[i] = (uint8_t)i;
    }

    // For each pivot to determine:
    for (unsigned i = 0; i < kRows; ++i)
    {
        bool found = false;

        // Find pivot
        for (unsigned j = i; j < kRows; ++j)
        {
            // Determine if the row contains a nonzero value in this column
            const unsigned ge_row_j = pivot[j];
            const uint8_t * ge_row = matrix + kColumns * ge_row_j;
            const uint8_t row0 = ge_row[offset + i];

            // If the value was nonzero:
            if (0 != row0)
            {
                found = true;

                // Swap out the pivot index for this one
                if (i != j)
                {
                    const uint8_t temp = pivot[i];
                    pivot[i] = pivot[j];
                    pivot[j] = temp;
                }

                // For each remaining unused row:
                for (unsigned k = j + 1; k < kRows; ++k)
                {
                    // Determine if the row contains the bit we want
                    const unsigned ge_row_k = pivot[k];
                    uint8_t * rem_row = matrix + kColumns * ge_row_k;
                    const uint8_t rem_value = rem_row[offset + i];

                    // If the value was nonzero:
                    if (0 != rem_value)
                    {
                        const uint8_t elim = gf256_div(rem_value, row0);

                        gf256_muladd_mem(rem_row + i, elim, ge_row + i, kRows - i);
                    }
                }

                break;
            }
        }

        // If pivot could not be found,
        if (!found) {
            return false;
        }
    }

    return true;
}